

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlNewComment(xmlChar *content)

{
  xmlNodePtr cur;
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  
  cur = (xmlNodePtr)(*xmlMalloc)(0x78);
  if (cur == (xmlNodePtr)0x0) {
LAB_0014d7b0:
    cur = (xmlNodePtr)0x0;
  }
  else {
    cur->_private = (void *)0x0;
    *(undefined8 *)&cur->type = 0;
    cur->name = (xmlChar *)0x0;
    cur->children = (_xmlNode *)0x0;
    cur->nsDef = (xmlNs *)0x0;
    cur->psvi = (void *)0x0;
    cur->content = (xmlChar *)0x0;
    cur->properties = (_xmlAttr *)0x0;
    cur->doc = (_xmlDoc *)0x0;
    cur->ns = (xmlNs *)0x0;
    cur->next = (_xmlNode *)0x0;
    cur->prev = (_xmlNode *)0x0;
    cur->last = (_xmlNode *)0x0;
    cur->parent = (_xmlNode *)0x0;
    cur->line = 0;
    cur->extra = 0;
    *(undefined4 *)&cur->field_0x74 = 0;
    cur->type = XML_COMMENT_NODE;
    cur->name = "comment";
    if (content != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(content);
      cur->content = pxVar1;
      if (pxVar1 == (xmlChar *)0x0) {
        xmlFreeNode(cur);
        goto LAB_0014d7b0;
      }
    }
    if (xmlRegisterCallbacks != 0) {
      pp_Var2 = __xmlRegisterNodeDefaultValue();
      if (*pp_Var2 != (xmlRegisterNodeFunc)0x0) {
        pp_Var2 = __xmlRegisterNodeDefaultValue();
        (**pp_Var2)(cur);
      }
    }
  }
  return cur;
}

Assistant:

xmlNodePtr
xmlNewComment(const xmlChar *content) {
    xmlNodePtr cur;

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_COMMENT_NODE;

    cur->name = xmlStringComment;
    if (content != NULL) {
	cur->content = xmlStrdup(content);
        if (cur->content == NULL)
            goto error;
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);

error:
    xmlFreeNode(cur);
    return(NULL);
}